

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O3

JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
(anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
          (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,void *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *bt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  JBTIndex JVar3;
  undefined4 extraout_var;
  size_type *local_40;
  size_type local_38;
  size_type local_30;
  undefined8 uStack_28;
  
  pcVar2 = (bt->Value)._M_dataplus._M_p;
  local_40 = &local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + (bt->Value)._M_string_length);
  JVar3 = anon_unknown.dwarf_25d623a::BacktraceData::Add
                    ((BacktraceData *)((long)this + 0x68),&bt->Backtrace);
  paVar1 = &(__return_storage_ptr__->Value).field_2;
  (__return_storage_ptr__->Value)._M_dataplus._M_p = (pointer)paVar1;
  if (local_40 == &local_30) {
    paVar1->_M_allocated_capacity = local_30;
    *(undefined8 *)((long)&(__return_storage_ptr__->Value).field_2 + 8) = uStack_28;
  }
  else {
    (__return_storage_ptr__->Value)._M_dataplus._M_p = (pointer)local_40;
    (__return_storage_ptr__->Value).field_2._M_allocated_capacity = local_30;
  }
  (__return_storage_ptr__->Value)._M_string_length = local_38;
  (__return_storage_ptr__->Backtrace).Index = JVar3.Index;
  return (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         CONCAT44(extraout_var,JVar3.Index);
}

Assistant:

JBT<T> ToJBT(BT<T> const& bt)
  {
    return JBT<T>(bt.Value, this->Backtraces.Add(bt.Backtrace));
  }